

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O2

VRDisplayNode *
MinVR::VRProjectionNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  VRProjectionNode *this;
  allocator<char> local_c5;
  float local_c4;
  string local_c0;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"NearClip",&local_c5);
  local_c4 = 0.001;
  std::__cxx11::string::string((string *)&local_30,(string *)nameSpace);
  local_94 = VRDataIndex::getValueWithDefault<float>(config,&local_c0,&local_c4,&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"FarClip",&local_c5);
  local_c4 = 500.0;
  std::__cxx11::string::string((string *)&local_50,(string *)nameSpace);
  local_98 = VRDataIndex::getValueWithDefault<float>(config,&local_c0,&local_c4,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"FieldOfViewY",&local_c5);
  local_c4 = 60.0;
  std::__cxx11::string::string((string *)&local_70,(string *)nameSpace);
  local_9c = VRDataIndex::getValueWithDefault<float>(config,&local_c0,&local_c4,&local_70,true);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"FieldOfViewX",&local_c5);
  local_c4 = 60.0;
  std::__cxx11::string::string((string *)&local_90,(string *)nameSpace);
  local_a0 = VRDataIndex::getValueWithDefault<float>(config,&local_c0,&local_c4,&local_90,true);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_c0);
  this = (VRProjectionNode *)operator_new(0xd0);
  VRProjectionNode(this,nameSpace,local_a0,local_9c,local_94,local_98);
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRProjectionNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace){
  float nearClip = config->getValueWithDefault("NearClip", 0.001f, nameSpace);
  float farClip = config->getValueWithDefault("FarClip", 500.0f, nameSpace);
  float fovY = config->getValueWithDefault("FieldOfViewY", 60.0f, nameSpace);
  float fovX = config->getValueWithDefault("FieldOfViewX", 60.0f, nameSpace);

  VRProjectionNode *node = new VRProjectionNode(nameSpace, fovX, fovY, nearClip, farClip);

  return node;
}